

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * __thiscall
testing::internal::FormatCompilerIndependentFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  internal *local_b0;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined4 local_58;
  allocator local_41;
  undefined1 local_40 [8];
  string file_name;
  int line_local;
  char *file_local;
  
  file_name.field_2._12_4_ = SUB84(file,0);
  local_b0 = this;
  if (this == (internal *)0x0) {
    local_b0 = (internal *)0x1af0ab;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,(char *)local_b0,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if ((int)file_name.field_2._12_4_ < 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
  }
  else {
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,":"
                  );
    StreamableToString<int>(&local_98,(int *)(file_name.field_2._M_local_buf + 0xc));
    std::operator+(__return_storage_ptr__,&local_78,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  local_58 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatCompilerIndependentFileLocation(
    const char* file, int line) {
  const std::string file_name(file == nullptr ? kUnknownFile : file);

  if (line < 0)
    return file_name;
  else
    return file_name + ":" + StreamableToString(line);
}